

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodePositions(ObjEncoder *this)

{
  EncoderBuffer *pEVar1;
  bool bVar2;
  PointAttribute *this_00;
  AttributeValueIndex att_id;
  bool bVar3;
  array<float,_3UL> value;
  float local_3c [3];
  
  bVar3 = false;
  this_00 = PointCloud::GetNamedAttribute(this->in_point_cloud_,POSITION);
  if (this_00 != (PointAttribute *)0x0) {
    if (this_00->num_unique_entries_ == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = this_00->num_unique_entries_ == 0;
      if (bVar3) {
LAB_00116e20:
        this->pos_att_ = this_00;
      }
      else {
        bVar2 = GeometryAttribute::ConvertValue<float>
                          (&this_00->super_GeometryAttribute,(AttributeValueIndex)0x0,'\x03',
                           local_3c);
        if (bVar2) {
          att_id.value_ = 1;
          do {
            pEVar1 = this->out_buffer_;
            if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar1,
                         (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,"v ","");
            }
            EncodeFloatList(this,local_3c,3);
            pEVar1 = this->out_buffer_;
            if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar1,
                         (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,"\n","");
            }
            bVar3 = this_00->num_unique_entries_ <= att_id.value_;
            if (bVar3) goto LAB_00116e20;
            bVar2 = GeometryAttribute::ConvertValue<float>
                              (&this_00->super_GeometryAttribute,att_id,'\x03',local_3c);
            att_id.value_ = att_id.value_ + 1;
          } while (bVar2);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ObjEncoder::EncodePositions() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::POSITION);
  if (att == nullptr || att->size() == 0) {
    return false;  // Position attribute must be valid.
  }
  std::array<float, 3> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 3>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("v ", 2);
    EncodeFloatList(&value[0], 3);
    buffer()->Encode("\n", 1);
  }
  pos_att_ = att;
  return true;
}